

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMeshSolution.cpp
# Opt level: O0

void __thiscall TPZMeshSolution::Print(TPZMeshSolution *this,ostream *out)

{
  int iVar1;
  ostream *poVar2;
  void *pvVar3;
  ostream *in_RSI;
  long *in_RDI;
  
  poVar2 = std::operator<<(in_RSI,"virtual void TPZMeshSolution::Print(std::ostream &)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RSI,"NFunctions = ");
  iVar1 = (**(code **)(*in_RDI + 0x70))();
  pvVar3 = (void *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RSI,"Polynomial Order = ");
  iVar1 = (**(code **)(*in_RDI + 0x68))();
  pvVar3 = (void *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TPZMeshSolution::Print(std::ostream &out)
{
    out << __PRETTY_FUNCTION__ << std::endl;
    out << "NFunctions = " << NFunctions() << std::endl;
    out << "Polynomial Order = " << PolynomialOrder() << std::endl;
}